

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

_Bool flatview_access_valid
                (uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,hwaddr len,_Bool is_write,
                MemTxAttrs attrs)

{
  _Bool _Var1;
  uint size;
  MemoryRegion_conflict *mr;
  undefined7 in_register_00000081;
  hwaddr l;
  hwaddr xlat;
  hwaddr local_50;
  undefined4 local_44;
  uc_struct_conflict15 *local_40;
  hwaddr local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000081,!is_write);
  local_40 = uc;
  for (; len != 0; len = len - local_50) {
    local_50 = len;
    mr = flatview_translate_tricore(uc,fv,addr,&local_38,&local_50,is_write,attrs);
    if ((is_write) && (mr->ram != false)) {
      if (mr->readonly != false) {
LAB_00b101ea:
        size = memory_access_size(mr,(uint)local_50,addr);
        local_50 = (hwaddr)(int)size;
        uc = local_40;
        _Var1 = memory_region_access_valid_tricore(local_40,mr,local_38,size,is_write,attrs);
        if (!_Var1) break;
      }
    }
    else if (((byte)local_44 & mr->ram) == 0) goto LAB_00b101ea;
    addr = addr + local_50;
  }
  return len == 0;
}

Assistant:

static bool flatview_access_valid(struct uc_struct *uc, FlatView *fv, hwaddr addr, hwaddr len,
                                  bool is_write, MemTxAttrs attrs)
{
    MemoryRegion *mr;
    hwaddr l, xlat;

    while (len > 0) {
        l = len;
        mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);
        if (!memory_access_is_direct(mr, is_write)) {
            l = memory_access_size(mr, l, addr);
            if (!memory_region_access_valid(uc, mr, xlat, l, is_write, attrs)) {
                return false;
            }
        }

        len -= l;
        addr += l;
    }
    return true;
}